

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O0

void __thiscall Equality_parseMath_Test::TestBody(Equality_parseMath_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *peVar4;
  char *pcVar5;
  AssertionResult local_450 [2];
  AssertHelper local_430 [8];
  Message local_428 [8];
  shared_ptr<libcellml::Component> local_420;
  shared_ptr<libcellml::Entity> local_410;
  bool local_3f9;
  undefined1 local_3f8 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_3c8 [8];
  Message local_3c0 [15];
  allocator<char> local_3b1;
  string local_3b0 [32];
  shared_ptr<libcellml::Component> local_390;
  shared_ptr<libcellml::Variable> local_380;
  shared_ptr<libcellml::Entity> local_370;
  bool local_359;
  undefined1 local_358 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_328 [8];
  Message local_320 [15];
  allocator<char> local_311;
  string local_310 [32];
  shared_ptr<libcellml::Component> local_2f0;
  shared_ptr<libcellml::Variable> local_2e0;
  shared_ptr<libcellml::Entity> local_2d0;
  bool local_2b9;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_288 [8];
  Message local_280 [15];
  allocator<char> local_271;
  string local_270 [32];
  shared_ptr<libcellml::Component> local_250;
  shared_ptr<libcellml::Variable> local_240;
  shared_ptr<libcellml::Entity> local_230;
  bool local_219;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_;
  string local_200 [39];
  allocator<char> local_1d9;
  string local_1d8 [39];
  allocator<char> local_1b1;
  string local_1b0 [32];
  undefined1 local_190 [8];
  VariablePtr sin;
  string local_178 [39];
  allocator<char> local_151;
  string local_150 [32];
  undefined1 local_130 [8];
  VariablePtr sin_initial_value;
  string local_118 [39];
  allocator<char> local_f1;
  string local_f0 [32];
  undefined1 local_d0 [8];
  VariablePtr x;
  string local_b8 [32];
  undefined1 local_98 [8];
  ComponentPtr component;
  allocator<char> local_71;
  string local_70 [32];
  string local_50 [32];
  undefined1 local_30 [8];
  ModelPtr model;
  ParserPtr parser;
  Equality_parseMath_Test *this_local;
  
  this_00 = &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  libcellml::Parser::create(SUB81(this_00,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_70,"deriv_approx_sin.xml",&local_71);
  fileContents(local_50);
  libcellml::Parser::parseModel((string *)local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b8,"sin",
             (allocator<char> *)
             ((long)&x.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Component::create((string *)local_98);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&x.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"x",&local_f1);
  libcellml::Variable::create((string *)local_d0);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator(&local_f1);
  peVar3 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_118,"dimensionless",
             (allocator<char> *)
             ((long)&sin_initial_value.
                     super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  libcellml::Variable::setUnits((string *)peVar3);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&sin_initial_value.
                     super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  peVar3 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_d0);
  libcellml::Variable::setInterfaceType((InterfaceType)peVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_150,"sin_initial_value",&local_151);
  libcellml::Variable::create((string *)local_130);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator(&local_151);
  peVar3 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_130);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_178,"dimensionless",
             (allocator<char> *)
             ((long)&sin.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Variable::setUnits((string *)peVar3);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&sin.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  peVar3 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_130);
  libcellml::Variable::setInterfaceType((InterfaceType)peVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,"sin",&local_1b1);
  libcellml::Variable::create((string *)local_190);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  peVar3 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1d8,"dimensionless",&local_1d9);
  libcellml::Variable::setUnits((string *)peVar3);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  peVar3 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_190);
  libcellml::Variable::setInterfaceType((InterfaceType)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_190);
  libcellml::Variable::setInitialValue((shared_ptr *)peVar3);
  peVar4 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_200,
             "<math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n      <apply><eq/>\n        <apply><diff/>\n          <bvar><ci>x</ci></bvar>\n          <ci>sin</ci>\n        </apply>\n        <apply><cos/>\n          <ci>x</ci>\n        </apply>\n      </apply>\n    </math>\n"
             ,(allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  libcellml::Component::setMath((string *)peVar4);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  peVar3 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_d0);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::ComponentEntity::component((ulong)&local_250);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_250);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_270,"x",&local_271);
  libcellml::Component::variable((string *)&local_240);
  std::shared_ptr<libcellml::Entity>::shared_ptr<libcellml::Variable,void>(&local_230,&local_240);
  bVar1 = libcellml::Entity::equals((shared_ptr *)peVar3);
  local_219 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_218,&local_219,(type *)0x0);
  std::shared_ptr<libcellml::Entity>::~shared_ptr(&local_230);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_240);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator(&local_271);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_250);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar2) {
    testing::Message::Message(local_280);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__1.message_,local_218,
               "x->equals(model->component(0)->variable(\"x\"))","false");
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x3d0,pcVar5);
    testing::internal::AssertHelper::operator=(local_288,local_280);
    testing::internal::AssertHelper::~AssertHelper(local_288);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  peVar3 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_130);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::ComponentEntity::component((ulong)&local_2f0);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_2f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_310,"sin_initial_value",&local_311);
  libcellml::Component::variable((string *)&local_2e0);
  std::shared_ptr<libcellml::Entity>::shared_ptr<libcellml::Variable,void>(&local_2d0,&local_2e0);
  bVar1 = libcellml::Entity::equals((shared_ptr *)peVar3);
  local_2b9 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2b8,&local_2b9,(type *)0x0);
  std::shared_ptr<libcellml::Entity>::~shared_ptr(&local_2d0);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_2e0);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator(&local_311);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_2f0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
  if (!bVar2) {
    testing::Message::Message(local_320);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__2.message_,local_2b8,
               "sin_initial_value->equals(model->component(0)->variable(\"sin_initial_value\"))",
               "false");
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x3d1,pcVar5);
    testing::internal::AssertHelper::operator=(local_328,local_320);
    testing::internal::AssertHelper::~AssertHelper(local_328);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(local_320);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
  peVar3 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_190);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::ComponentEntity::component((ulong)&local_390);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_390);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3b0,"sin",&local_3b1);
  libcellml::Component::variable((string *)&local_380);
  std::shared_ptr<libcellml::Entity>::shared_ptr<libcellml::Variable,void>(&local_370,&local_380);
  bVar1 = libcellml::Entity::equals((shared_ptr *)peVar3);
  local_359 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_358,&local_359,(type *)0x0);
  std::shared_ptr<libcellml::Entity>::~shared_ptr(&local_370);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_380);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_390);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
  if (!bVar2) {
    testing::Message::Message(local_3c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__3.message_,local_358,
               "sin->equals(model->component(0)->variable(\"sin\"))","false");
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x3d2,pcVar5);
    testing::internal::AssertHelper::operator=(local_3c8,local_3c0);
    testing::internal::AssertHelper::~AssertHelper(local_3c8);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(local_3c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
  peVar4 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_98);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::ComponentEntity::component((ulong)&local_420);
  std::shared_ptr<libcellml::Entity>::shared_ptr<libcellml::Component,void>(&local_410,&local_420);
  bVar1 = libcellml::Entity::equals((shared_ptr *)peVar4);
  local_3f9 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3f8,&local_3f9,(type *)0x0);
  std::shared_ptr<libcellml::Entity>::~shared_ptr(&local_410);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_420);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f8);
  if (!bVar2) {
    testing::Message::Message(local_428);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_450,local_3f8,"component->equals(model->component(0))","false");
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_430,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x3d4,pcVar5);
    testing::internal::AssertHelper::operator=(local_430,local_428);
    testing::internal::AssertHelper::~AssertHelper(local_430);
    std::__cxx11::string::~string((string *)local_450);
    testing::Message::~Message(local_428);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f8);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_190);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_130);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_d0);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_98);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_30);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Equality, parseMath)
{
    libcellml::ParserPtr parser = libcellml::Parser::create();
    libcellml::ModelPtr model = parser->parseModel(fileContents("deriv_approx_sin.xml"));

    libcellml::ComponentPtr component = libcellml::Component::create("sin");

    libcellml::VariablePtr x = libcellml::Variable::create("x");
    x->setUnits("dimensionless");
    x->setInterfaceType(libcellml::Variable::InterfaceType::PUBLIC_AND_PRIVATE);

    libcellml::VariablePtr sin_initial_value = libcellml::Variable::create("sin_initial_value");
    sin_initial_value->setUnits("dimensionless");
    sin_initial_value->setInterfaceType(libcellml::Variable::InterfaceType::PUBLIC_AND_PRIVATE);

    libcellml::VariablePtr sin = libcellml::Variable::create("sin");
    sin->setUnits("dimensionless");
    sin->setInterfaceType(libcellml::Variable::InterfaceType::PUBLIC_AND_PRIVATE);
    sin->setInitialValue(sin_initial_value);

    component->setMath(
        "<math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n"
        "      <apply><eq/>\n"
        "        <apply><diff/>\n"
        "          <bvar><ci>x</ci></bvar>\n"
        "          <ci>sin</ci>\n"
        "        </apply>\n"
        "        <apply><cos/>\n"
        "          <ci>x</ci>\n"
        "        </apply>\n"
        "      </apply>\n"
        "    </math>\n");

    EXPECT_TRUE(x->equals(model->component(0)->variable("x")));
    EXPECT_TRUE(sin_initial_value->equals(model->component(0)->variable("sin_initial_value")));
    EXPECT_TRUE(sin->equals(model->component(0)->variable("sin")));

    EXPECT_TRUE(component->equals(model->component(0)));
}